

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O1

void __thiscall
iDynTree::optimalcontrol::L2NormCost::L2NormCost
          (L2NormCost *this,string *name,uint stateDimension,uint controlDimension)

{
  L2NormCostImplementation *this_00;
  IndexRange stateRange;
  IndexRange local_30;
  
  Cost::Cost(&this->super_Cost,name);
  (this->super_Cost)._vptr_Cost = (_func_int **)&PTR__L2NormCost_0019afc0;
  this_00 = (L2NormCostImplementation *)operator_new(0x250);
  CostAttributes::CostAttributes((CostAttributes *)this_00);
  CostAttributes::CostAttributes(&this_00->controlCost);
  this->m_pimpl = this_00;
  if (stateDimension != 0) {
    local_30.offset = 0;
    local_30.size = (ptrdiff_t)stateDimension;
    CostAttributes::initializeCost((CostAttributes *)this_00,&local_30,stateDimension);
  }
  if (controlDimension != 0) {
    local_30.offset = 0;
    local_30.size = (ptrdiff_t)controlDimension;
    CostAttributes::initializeCost(&this->m_pimpl->controlCost,&local_30,controlDimension);
  }
  return;
}

Assistant:

L2NormCost::L2NormCost(const std::string &name, unsigned int stateDimension, unsigned int controlDimension)
            : Cost(name)
            , m_pimpl(new L2NormCostImplementation)
        {
            if (stateDimension > 0) {
                IndexRange stateRange;
                stateRange.offset = 0;
                stateRange.size = stateDimension;

                m_pimpl->stateCost.initializeCost(stateRange, stateDimension);
            }

            if (controlDimension > 0) {
                IndexRange controlRange;
                controlRange.offset = 0;
                controlRange.size = controlDimension;

                m_pimpl->controlCost.initializeCost(controlRange, controlDimension);
            }
        }